

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O2

bool spdlog::details::os::is_color_terminal(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *env_term_p;
  char *local_28;
  undefined1 *local_20;
  
  if (is_color_terminal()::result == '\0') {
    iVar2 = __cxa_guard_acquire(&is_color_terminal()::result);
    if (iVar2 != 0) {
      pcVar3 = ::getenv("COLORTERM");
      bVar1 = true;
      if (pcVar3 == (char *)0x0) {
        local_28 = ::getenv("TERM");
        if (local_28 != (char *)0x0) {
          local_20 = (undefined1 *)&local_28;
          for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 0x20) {
            bVar1 = __gnu_cxx::__ops::
                    _Iter_pred<spdlog::details::os::is_color_terminal()::$_0::operator()()const::{lambda(char_const*)#1}>
                    ::operator()((_Iter_pred<spdlog::details::os::is_color_terminal()::__0::operator()()const::_lambda(char_const*)_1_>
                                  *)&local_20,
                                 (char **)(is_color_terminal()::$_0::operator()()::terms + lVar4));
            if (bVar1) {
LAB_0013d915:
              bVar1 = lVar4 != 0x80;
              goto LAB_0013d91f;
            }
            bVar1 = __gnu_cxx::__ops::
                    _Iter_pred<spdlog::details::os::is_color_terminal()::$_0::operator()()const::{lambda(char_const*)#1}>
                    ::operator()((_Iter_pred<spdlog::details::os::is_color_terminal()::__0::operator()()const::_lambda(char_const*)_1_>
                                  *)&local_20,
                                 (char **)(is_color_terminal()::$_0::operator()()::terms + lVar4 + 8
                                          ));
            if (bVar1) {
              lVar4 = lVar4 + 8;
              goto LAB_0013d915;
            }
            bVar1 = __gnu_cxx::__ops::
                    _Iter_pred<spdlog::details::os::is_color_terminal()::$_0::operator()()const::{lambda(char_const*)#1}>
                    ::operator()((_Iter_pred<spdlog::details::os::is_color_terminal()::__0::operator()()const::_lambda(char_const*)_1_>
                                  *)&local_20,
                                 (char **)(is_color_terminal()::$_0::operator()()::terms +
                                          lVar4 + 0x10));
            if (bVar1) {
              lVar4 = lVar4 + 0x10;
              goto LAB_0013d915;
            }
            bVar1 = __gnu_cxx::__ops::
                    _Iter_pred<spdlog::details::os::is_color_terminal()::$_0::operator()()const::{lambda(char_const*)#1}>
                    ::operator()((_Iter_pred<spdlog::details::os::is_color_terminal()::__0::operator()()const::_lambda(char_const*)_1_>
                                  *)&local_20,
                                 (char **)(is_color_terminal()::$_0::operator()()::terms +
                                          lVar4 + 0x18));
            if (bVar1) {
              lVar4 = lVar4 + 0x18;
              goto LAB_0013d915;
            }
          }
        }
        bVar1 = false;
      }
LAB_0013d91f:
      is_color_terminal::result = bVar1;
      __cxa_guard_release(&is_color_terminal()::result);
    }
  }
  return is_color_terminal::result;
}

Assistant:

SPDLOG_INLINE bool is_color_terminal() SPDLOG_NOEXCEPT
{
#ifdef _WIN32
    return true;
#else

    static const bool result = []() {
        const char *env_colorterm_p = std::getenv("COLORTERM");
        if (env_colorterm_p != nullptr)
        {
            return true;
        }

        static constexpr std::array<const char *, 16> terms = {{"ansi", "color", "console", "cygwin", "gnome", "konsole", "kterm", "linux",
            "msys", "putty", "rxvt", "screen", "vt100", "xterm", "alacritty", "vt102"}};

        const char *env_term_p = std::getenv("TERM");
        if (env_term_p == nullptr)
        {
            return false;
        }

        return std::any_of(terms.begin(), terms.end(), [&](const char *term) { return std::strstr(env_term_p, term) != nullptr; });
    }();

    return result;
#endif
}